

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAddxEa<(moira::Instr)122,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  Moira *in_RDI;
  u32 result;
  u32 data2;
  u32 data1;
  u32 ea2;
  u32 ea1;
  int dst;
  int src;
  u64 flags;
  u32 in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffbc;
  u32 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Moira *in_stack_ffffffffffffffd8;
  
  bVar1 = readOp<(moira::Mode)4,(moira::Size)2,64ul>
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                     (u32 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (u32 *)in_RDI);
  if (bVar1) {
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,0xfffffffe);
    bVar1 = readOp<(moira::Mode)4,(moira::Size)2,64ul>
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                       (u32 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (u32 *)in_RDI);
    if (bVar1) {
      addsub<(moira::Instr)122,(moira::Size)2>
                ((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      prefetch<0ul>(in_RDI);
      writeM<(moira::Mode)4,(moira::Size)2,4ul>
                (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void
Moira::execAddxEa(u16 opcode)
{
    const u64 flags =
    (S == Word) ? AE_INC_PC : (S == Long) ? AE_INC_PC | AE_INC_ADDR : 0;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea1, ea2, data1, data2;
 
    if (!readOp<M,S, flags>(src, ea1, data1)) {
        if (S == Long) undoAnPD<M,S>(src);
        return;
    }
    
    sync(-2);
    
    if (!readOp<M,S, flags>(dst, ea2, data2)) {
        if (S == Long) undoAnPD<M,S>(dst);
        return;
    }

    u32 result = addsub<I,S>(data1, data2);

    if (S == Long && !MIMIC_MUSASHI) {
        writeM <M, Word> (ea2 + 2, result & 0xFFFF);
        prefetch();
        writeM<M, Word, POLLIPL>(ea2, result >> 16);
        return;
    }

    prefetch();
    writeM<M, S, POLLIPL>(ea2, result);
}